

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockExpectedCall_toStringForCallOrderMultiple_TestShell::createTest
          (TEST_MockExpectedCall_toStringForCallOrderMultiple_TestShell *this)

{
  TEST_MockExpectedCall_toStringForCallOrderMultiple_Test *this_00;
  
  this_00 = (TEST_MockExpectedCall_toStringForCallOrderMultiple_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0x286);
  TEST_MockExpectedCall_toStringForCallOrderMultiple_Test::
  TEST_MockExpectedCall_toStringForCallOrderMultiple_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCall, toStringForCallOrderMultiple)
{
    MockCheckedExpectedCall expectedCall(5);
    expectedCall.withName("name");
    expectedCall.withCallOrder(5, 9);
    expectedCall.callWasMade(5);
    expectedCall.callWasMade(6);
    expectedCall.callWasMade(7);
    expectedCall.callWasMade(8);
    expectedCall.callWasMade(9);
    STRCMP_EQUAL("name -> expected calls order: <5..9> -> no parameters (expected 5 calls, called 5 times)", expectedCall.callToString().asCharString());
}